

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day16a.cpp
# Opt level: O0

void day16a::almost_dragon_curve(string *data,int size)

{
  int *piVar1;
  undefined1 local_2d;
  int local_2c;
  int local_28;
  int i;
  long lStack_20;
  int iterations;
  char *ptr;
  int len;
  int size_local;
  string *data_local;
  
  ptr._4_4_ = size;
  _len = data;
  ptr._0_4_ = std::__cxx11::string::size();
  std::__cxx11::string::resize((ulong)_len);
  lStack_20 = std::__cxx11::string::data();
  while( true ) {
    local_28 = (ptr._4_4_ - (int)ptr) + -1;
    piVar1 = std::min<int>((int *)&ptr,&local_28);
    i = *piVar1;
    if (i < 0) break;
    *(undefined1 *)(lStack_20 + (int)ptr) = 0x30;
    for (local_2c = 0; local_2c < i; local_2c = local_2c + 1) {
      local_2d = 0x31;
      if (*(char *)(lStack_20 + (((int)ptr - local_2c) + -1)) != '0') {
        local_2d = 0x30;
      }
      *(undefined1 *)(lStack_20 + ((int)ptr + local_2c + 1)) = local_2d;
    }
    ptr._0_4_ = (int)ptr * 2 + 1;
  }
  return;
}

Assistant:

void almost_dragon_curve(std::string& data, int size) {
		int len = data.size();
		data.resize(size);
		char* ptr = const_cast<char*>(data.data());
		for(;;) {
			int iterations = std::min(len, size - len - 1);
			if(iterations < 0) {
				break;
			}
			ptr[len] = '0';
			for(int i = 0; i < iterations; ++i) {
				ptr[len + i + 1] = ptr[len - i - 1] == '0' ? '1' : '0';
			}
			len = len * 2 + 1;
		}
	}